

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O2

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Biquad::getPoleZeros
          (vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *__return_storage_ptr__,
          Biquad *this)

{
  BiquadPoleState bps;
  BiquadPoleState BStack_58;
  
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BiquadPoleState::BiquadPoleState(&BStack_58,this);
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::push_back
            (__return_storage_ptr__,&BStack_58.super_PoleZeroPair);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PoleZeroPair> Biquad::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		BiquadPoleState bps (*this);
		vpz.push_back (bps);
		return vpz;
	}